

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void amrex::anon_unknown_12::anon_unknown_0::sgetval<long>
               (Table *table,string *name,long *ptr,int ival,int occurrence)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RSI;
  char *in_RDI;
  int in_R8D;
  bool in_stack_0000004f;
  ostream *in_stack_00000050;
  long *in_stack_fffffffffffffff8;
  
  bVar1 = squeryval<long>((Table *)ptr,(string *)CONCAT44(ival,occurrence),in_stack_fffffffffffffff8
                          ,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if (!bVar1) {
    poVar2 = ErrorStream();
    std::operator<<(poVar2,"ParmParse::getval ");
    if (-1 < in_R8D) {
      poVar2 = ErrorStream();
      poVar2 = std::operator<<(poVar2,"occurrence number ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_R8D);
      std::operator<<(poVar2," of ");
    }
    poVar2 = ErrorStream();
    poVar2 = std::operator<<(poVar2,"ParmParse::getval(): ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    poVar2 = std::operator<<(poVar2," not found in table");
    std::operator<<(poVar2,'\n');
    ErrorStream();
    ParmParse::dumpTable(in_stack_00000050,in_stack_0000004f);
    Abort_host(in_RDI);
  }
  return;
}

Assistant:

void
sgetval (const ParmParse::Table& table,
         const std::string& name,
         T&           ptr,
         int          ival,
         int          occurrence)
{
    if ( squeryval(table, name,ptr,ival,occurrence) == 0 )
    {
        amrex::ErrorStream() << "ParmParse::getval ";
        if ( occurrence >= 0 )
        {
            amrex::ErrorStream() << "occurrence number "
                      << occurrence
                      << " of ";
        }

        amrex::ErrorStream() << "ParmParse::getval(): "
                  << name
                  << " not found in table"
                  << '\n';
        ParmParse::dumpTable(amrex::ErrorStream());
        amrex::Abort();
    }
}